

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O0

uint256 * BlockMerkleRoot(CBlock *block,bool *mutated)

{
  bool *pbVar1;
  uint256 *puVar2;
  reference pvVar3;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  size_t s;
  vector<uint256,_std::allocator<uint256>_> leaves;
  CTransaction *in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff60;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffff68;
  vector<uint256,_std::allocator<uint256>_> *this;
  size_type in_stack_ffffffffffffff70;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffff78;
  bool *pbVar4;
  bool *mutated_00;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffffa8;
  vector<uint256,_std::allocator<uint256>_> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff58);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffff58);
  std::vector<uint256,_std::allocator<uint256>_>::resize
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  pbVar4 = (bool *)0x0;
  while( true ) {
    mutated_00 = pbVar4;
    pbVar1 = (bool *)std::
                     vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             *)in_stack_ffffffffffffff58);
    if (pbVar1 <= pbVar4) break;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[](in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff58);
    CTransaction::GetHash(in_stack_ffffffffffffff58);
    puVar2 = transaction_identifier::operator_cast_to_uint256_
                       ((transaction_identifier<false> *)in_stack_ffffffffffffff58);
    pvVar3 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff60);
    *(undefined8 *)(pvVar3->super_base_blob<256U>).m_data._M_elems =
         *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 8) =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x18) =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    pbVar4 = mutated_00 + 1;
  }
  this = local_38;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff58,
             (vector<uint256,_std::allocator<uint256>_> *)0x3dc302);
  ComputeMerkleRoot(in_stack_ffffffffffffffa8,mutated_00);
  std::vector<uint256,_std::allocator<uint256>_>::~vector(this);
  std::vector<uint256,_std::allocator<uint256>_>::~vector(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

uint256 BlockMerkleRoot(const CBlock& block, bool* mutated)
{
    std::vector<uint256> leaves;
    leaves.resize(block.vtx.size());
    for (size_t s = 0; s < block.vtx.size(); s++) {
        leaves[s] = block.vtx[s]->GetHash();
    }
    return ComputeMerkleRoot(std::move(leaves), mutated);
}